

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

bool __thiscall minja::Value::to_bool(Value *this)

{
  bool bVar1;
  byte bVar2;
  double dVar3;
  Value *in_stack_00000020;
  Value *in_stack_00000038;
  Value *in_stack_ffffffffffffffd0;
  Value *in_stack_ffffffffffffffe8;
  bool local_1;
  
  bVar1 = is_null(in_stack_ffffffffffffffd0);
  if (bVar1) {
    local_1 = false;
  }
  else {
    bVar1 = is_boolean((Value *)0x2a9070);
    if (bVar1) {
      local_1 = get<bool>(in_stack_00000020);
    }
    else {
      bVar1 = is_number((Value *)0x2a9093);
      if (bVar1) {
        dVar3 = get<double>(in_stack_00000020);
        local_1 = dVar3 != 0.0;
      }
      else {
        bVar1 = is_string((Value *)0x2a90c2);
        if (bVar1) {
          get<std::__cxx11::string>(in_stack_00000038);
          bVar2 = std::__cxx11::string::empty();
          local_1 = (bool)((bVar2 ^ 0xff) & 1);
          std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
        }
        else {
          bVar1 = is_array((Value *)0x2a90fd);
          if (bVar1) {
            bVar1 = empty(in_stack_ffffffffffffffe8);
            local_1 = (bool)((bVar1 ^ 0xffU) & 1);
          }
          else {
            local_1 = true;
          }
        }
      }
    }
  }
  return local_1;
}

Assistant:

bool to_bool() const {
    if (is_null()) return false;
    if (is_boolean()) return get<bool>();
    if (is_number()) return get<double>() != 0;
    if (is_string()) return !get<std::string>().empty();
    if (is_array()) return !empty();
    return true;
  }